

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_12b021::TooHigh::TooHigh(TooHigh *this,STRING *value)

{
  STRING *value_local;
  TooHigh *this_local;
  
  FIX::StringField::StringField(&this->super_StringField,0x1f5,value);
  (this->super_StringField).super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__TooHigh_00504820;
  return;
}

Assistant:

static void fillHeaderTrailer(FIX44::Message &message) {
  message.getHeader().set(FIX::BodyLength(0));
  message.getHeader().set(SenderCompID("FIXTEST"));
  message.getHeader().set(TargetCompID("TW"));
  message.getHeader().set(MsgSeqNum(1));
  message.getHeader().set(SendingTime(UtcTimeStamp::now()));
  message.getTrailer().set(CheckSum(0));
}